

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

bool EqualNode::ParameterToLong(char *param,long *outResult)

{
  char cVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  int __base;
  char *pEnd;
  char *local_30;
  
  cVar1 = *param;
  iVar2 = strncmp(param,"0b",2);
  if ((iVar2 == 0) || (iVar2 = strncmp(param,"0B",2), iVar2 == 0)) {
    param = param + 2;
  }
  else {
    iVar2 = strncmp(param,"-0b",3);
    if (((iVar2 != 0) && (iVar2 = strncmp(param,"-0B",3), iVar2 != 0)) &&
       (iVar2 = strncmp(param,"+0b",3), iVar2 != 0)) {
      iVar2 = strncmp(param,"+0B",3);
      __base = 0;
      if (iVar2 != 0) goto LAB_003d5b63;
    }
    param = param + 3;
  }
  __base = 2;
LAB_003d5b63:
  lVar3 = strtol(param,&local_30,__base);
  if (((local_30 != param) && (*local_30 == '\0')) && (piVar4 = __errno_location(), *piVar4 != 0x22)
     ) {
    lVar5 = -lVar3;
    if (lVar3 < 1) {
      lVar5 = lVar3;
    }
    if (cVar1 != '-') {
      lVar5 = lVar3;
    }
    *outResult = lVar5;
    return true;
  }
  return false;
}

Assistant:

static bool ParameterToLong(const char* param, long* outResult)
  {
    const char isNegative = param[0] == '-';

    int base = 0;
    if (cmHasLiteralPrefix(param, "0b") || cmHasLiteralPrefix(param, "0B")) {
      base = 2;
      param += 2;
    } else if (cmHasLiteralPrefix(param, "-0b") ||
               cmHasLiteralPrefix(param, "-0B") ||
               cmHasLiteralPrefix(param, "+0b") ||
               cmHasLiteralPrefix(param, "+0B")) {
      base = 2;
      param += 3;
    }

    char* pEnd;
    long result = strtol(param, &pEnd, base);
    if (pEnd == param || *pEnd != '\0' || errno == ERANGE) {
      return false;
    }
    if (isNegative && result > 0) {
      result *= -1;
    }
    *outResult = result;
    return true;
  }